

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint32_t findTaggedConverterNum(char *alias,char *standard,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t convLimit;
  uint32_t convStart;
  uint32_t tagNum;
  UErrorCode myErr;
  uint32_t convNum;
  uint32_t listOffset;
  uint32_t idx;
  UErrorCode *pErrorCode_local;
  char *standard_local;
  char *alias_local;
  
  convStart = 0;
  _listOffset = pErrorCode;
  pErrorCode_local = (UErrorCode *)standard;
  standard_local = alias;
  uVar2 = getTagNumber(standard);
  tagNum = findConverter(standard_local,(UBool *)0x0,(UErrorCode *)&convStart);
  if (convStart != 0) {
    *_listOffset = convStart;
  }
  if ((uVar2 < gMainTable.tagListSize - 1) && (tagNum < gMainTable.converterListSize)) {
    myErr = (UErrorCode)gMainTable.taggedAliasArray[uVar2 * gMainTable.converterListSize + tagNum];
    if ((myErr != U_ZERO_ERROR) && (UVar1 = isAliasInList(standard_local,myErr), UVar1 != '\0')) {
      return tagNum;
    }
    if (convStart == 0xffffff86) {
      uVar3 = (uVar2 + 1) * gMainTable.converterListSize;
      uVar2 = uVar2 * gMainTable.converterListSize;
      for (convNum = uVar2; convNum < uVar3; convNum = convNum + 1) {
        myErr = (UErrorCode)gMainTable.taggedAliasArray[convNum];
        if ((myErr != U_ZERO_ERROR) && (UVar1 = isAliasInList(standard_local,myErr), UVar1 != '\0'))
        {
          return convNum - uVar2;
        }
      }
    }
  }
  return 0xffffffff;
}

Assistant:

static uint32_t
findTaggedConverterNum(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    uint32_t idx;
    uint32_t listOffset;
    uint32_t convNum;
    UErrorCode myErr = U_ZERO_ERROR;
    uint32_t tagNum = getTagNumber(standard);

    /* Make a quick guess. Hopefully they used a TR22 canonical alias. */
    convNum = findConverter(alias, NULL, &myErr);
    if (myErr != U_ZERO_ERROR) {
        *pErrorCode = myErr;
    }

    if (tagNum < (gMainTable.tagListSize - UCNV_NUM_HIDDEN_TAGS) && convNum < gMainTable.converterListSize) {
        listOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + convNum];
        if (listOffset && isAliasInList(alias, listOffset)) {
            return convNum;
        }
        if (myErr == U_AMBIGUOUS_ALIAS_WARNING) {
            /* Uh Oh! They used an ambiguous alias.
               We have to search one slice of the swiss cheese.
               We search only in the requested tag, not the whole thing.
               This may take a while.
            */
            uint32_t convStart = (tagNum)*gMainTable.converterListSize;
            uint32_t convLimit = (tagNum+1)*gMainTable.converterListSize;
            for (idx = convStart; idx < convLimit; idx++) {
                listOffset = gMainTable.taggedAliasArray[idx];
                if (listOffset && isAliasInList(alias, listOffset)) {
                    return idx-convStart;
                }
            }
            /* The standard doesn't know about the alias */
        }
        /* else no canonical name */
    }
    /* else converter or tag not found */

    return UINT32_MAX;
}